

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ValidityColumnData::AppendData
          (ValidityColumnData *this,BaseStatistics *stats,ColumnAppendState *state,
          UnifiedVectorFormat *vdata,idx_t count)

{
  mutex *__mutex;
  int iVar1;
  
  __mutex = &(this->super_ColumnData).stats_lock;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    ColumnData::AppendData(&this->super_ColumnData,stats,state,vdata,count);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void ValidityColumnData::AppendData(BaseStatistics &stats, ColumnAppendState &state, UnifiedVectorFormat &vdata,
                                    idx_t count) {
	lock_guard<mutex> l(stats_lock);
	ColumnData::AppendData(stats, state, vdata, count);
}